

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void rollback_to_wal_test(bool multi_kv)

{
  void *__s1;
  void *__s2;
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  fdb_doc *doc;
  undefined7 in_register_00000039;
  ulong uVar8;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_kvs_handle *snap_db;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *local_de8;
  fdb_file_handle *local_de0;
  fdb_doc **local_dd8;
  long local_dd0;
  fdb_doc *local_dc8;
  undefined4 local_dbc;
  fdb_kvs_handle *local_db8;
  timeval local_db0;
  fdb_kvs_config local_da0;
  char local_d88 [256];
  char local_c88 [256];
  char local_b88 [256];
  fdb_doc *pfStack_a88;
  size_t *local_a80;
  fdb_doc *apfStack_5d8 [150];
  fdb_config local_128;
  
  gettimeofday(&local_db0,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x100;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  local_dbc = (undefined4)CONCAT71(in_register_00000039,multi_kv);
  local_128.multi_kv_instances = multi_kv;
  fdb_open(&local_de0,"./mvcc_test8",&local_128);
  fdb_kvs_open_default(local_de0,&local_de8,&local_da0);
  fVar1 = fdb_set_log_callback(local_de8,logCallbackFunc,"rollback_to_wal_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1154);
    rollback_to_wal_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1154,"void rollback_to_wal_test(bool)");
  }
  lVar7 = 0;
  for (uVar8 = 0; uVar8 != 300; uVar8 = uVar8 + 1) {
    sprintf(local_b88,"key%d",uVar8 & 0xffffffff);
    sprintf(local_c88,"meta%d",uVar8 & 0xffffffff);
    sprintf(local_d88,"body%d",uVar8 & 0xffffffff);
    sVar3 = strlen(local_b88);
    sVar4 = strlen(local_c88);
    sVar5 = strlen(local_d88);
    fdb_doc_create((fdb_doc **)((long)&pfStack_a88 + lVar7),local_b88,sVar3,local_c88,sVar4,
                   local_d88,sVar5);
    fdb_set(local_de8,(&pfStack_a88)[uVar8]);
    lVar7 = lVar7 + 8;
  }
  fdb_commit(local_de0,'\0');
  lVar7 = 0;
  for (uVar8 = 0; uVar8 != 0x96; uVar8 = uVar8 + 1) {
    local_dd8 = (fdb_doc **)((long)&pfStack_a88 + lVar7);
    local_dd0 = lVar7;
    fdb_doc_free((&pfStack_a88)[uVar8]);
    sprintf(local_b88,"key%d",uVar8 & 0xffffffff);
    sprintf(local_c88,"META%d",uVar8 & 0xffffffff);
    sprintf(local_d88,"BODY%d",uVar8 & 0xffffffff);
    sVar3 = strlen(local_b88);
    sVar4 = strlen(local_c88);
    sVar5 = strlen(local_d88);
    fdb_doc_create(local_dd8,local_b88,sVar3,local_c88,sVar4,local_d88,sVar5);
    fdb_set(local_de8,(&pfStack_a88)[uVar8]);
    lVar7 = local_dd0 + 8;
  }
  fdb_commit(local_de0,'\0');
  lVar7 = 0x4b0;
  for (uVar8 = 0x96; uVar8 != 300; uVar8 = uVar8 + 1) {
    local_dd8 = (fdb_doc **)((long)&pfStack_a88 + lVar7);
    local_dd0 = lVar7;
    fdb_doc_free((&pfStack_a88)[uVar8]);
    sprintf(local_b88,"key%d",uVar8 & 0xffffffff);
    sprintf(local_c88,"Meta%d",uVar8 & 0xffffffff);
    sprintf(local_d88,"Body%d",uVar8 & 0xffffffff);
    sVar3 = strlen(local_b88);
    sVar4 = strlen(local_c88);
    sVar5 = strlen(local_d88);
    fdb_doc_create(local_dd8,local_b88,sVar3,local_c88,sVar4,local_d88,sVar5);
    fdb_set(local_de8,(&pfStack_a88)[uVar8]);
    lVar7 = local_dd0 + 8;
  }
  fdb_commit(local_de0,'\0');
  fVar1 = fdb_rollback(&local_de8,0x1c2);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1180);
    rollback_to_wal_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1180,"void rollback_to_wal_test(bool)");
  }
  fdb_doc_create(&local_dc8,(void *)local_a80[4],*local_a80,(void *)0x0,0,(void *)0x0,0);
  fVar1 = fdb_snapshot_open(local_de8,&local_db8,0x1c2);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1184);
    rollback_to_wal_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1184,"void rollback_to_wal_test(bool)");
  }
  fVar1 = fdb_get(local_db8,local_dc8);
  doc = local_dc8;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    __s1 = local_dc8->body;
    __s2 = (void *)local_a80[8];
    iVar2 = bcmp(__s1,__s2,local_dc8->bodylen);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",__s2,__s1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1187);
      rollback_to_wal_test(bool)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1187,"void rollback_to_wal_test(bool)");
    }
    if (doc->seqnum != 0x12e) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1188);
      rollback_to_wal_test(bool)::__test_pass = '\x01';
      doc = local_dc8;
      if (local_dc8->seqnum != 0x12e) {
        __assert_fail("rdoc->seqnum == (fdb_seqnum_t)n + i + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1188,"void rollback_to_wal_test(bool)");
      }
    }
    fdb_doc_free(doc);
    fdb_kvs_close(local_db8);
    fdb_close(local_de0);
    for (lVar7 = 0; lVar7 != 300; lVar7 = lVar7 + 1) {
      fdb_doc_free((&pfStack_a88)[lVar7]);
    }
    fdb_shutdown();
    memleak_end();
    pcVar6 = "single kv mode:";
    if ((char)local_dbc != '\0') {
      pcVar6 = "multiple kv mode:";
    }
    sprintf(local_d88,"rollback to wal test %s",pcVar6);
    pcVar6 = "%s PASSED\n";
    if (rollback_to_wal_test(bool)::__test_pass != '\0') {
      pcVar6 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar6,local_d88);
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x1186);
  rollback_to_wal_test(bool)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1186,"void rollback_to_wal_test(bool)");
}

Assistant:

void rollback_to_wal_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 300;
    int num_kvs = 1;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_kvs_handle *snap_db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 256;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;

    // open db
    fdb_open(&dbfile, "./mvcc_test8", &fconfig);

    fdb_kvs_open_default(dbfile, &db[0], &kvs_config);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "rollback_to_wal_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
    for (i=0; i<n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db[0], doc[i]);
    } // after 256 items wal gets flushed before commit

    // commit normal but as wal was flushed, this will cause a wal flush again!
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // update first half documents again
    for (i = 0; i < n/2; i++){
        fdb_doc_free(doc[i]);
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "META%d", i);
        sprintf(bodybuf, "BODY%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db[0], doc[i]);
    }

    // commit again, this time wal threshold not hit so no wal flush on commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // update remaining half documents
    for (; i < n; i++){
        fdb_doc_free(doc[i]);
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "Meta%d", i);
        sprintf(bodybuf, "Body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db[0], doc[i]);
    } // somewhere in this loop wal gets flushed before commit
    // normal commit results in wal flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    status = fdb_rollback(&db[0], n + n/2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 1; // pick a document in the WAL section upon rollback
    fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
    status = fdb_snapshot_open(db[0], &snap_db, n + n/2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_get(snap_db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)n + i + 1);
    fdb_doc_free(rdoc);
    fdb_kvs_close(snap_db);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback to wal test %s", multi_kv ? "multiple kv mode:"
                                                         : "single kv mode:");
    TEST_RESULT(bodybuf);
}